

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

uint64_t color_cell_compression_est_mode7
                   (uint32_t num_pixels,color_quad_u8 *pPixels,bc7enc_bool perceptual,
                   uint32_t *pweights,uint64_t best_err_so_far)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int *in_RCX;
  long lVar6;
  ulong uVar7;
  char in_DL;
  long in_RSI;
  uint in_EDI;
  ulong in_R8;
  int da;
  int db;
  int dg;
  int dr;
  color_quad_u8 *pE1_1;
  uint32_t s_1;
  int d_1;
  color_quad_u8 *pC_2;
  uint32_t i_5;
  int ie;
  int dca;
  int dcb;
  int dcr;
  int dl;
  int cb2;
  int cr2;
  int l2;
  uint32_t s;
  int d;
  color_quad_u8 *pC_1;
  uint32_t i_4;
  color_quad_u8 *pE1;
  int j;
  int cb1 [4];
  int cr1 [4];
  int l1 [4];
  uint64_t total_err;
  uint32_t i_3;
  int thresh [3];
  uint32_t i_2;
  int dots [4];
  int aa;
  int ab;
  int ag;
  int ar;
  uint32_t i_1;
  color_quad_u8 weightedColors [4];
  uint32_t N;
  color_quad_u8 highColor;
  color_quad_u8 lowColor;
  color_quad_u8 *pC;
  uint32_t i;
  uint32_t ha;
  uint32_t hb;
  uint32_t hg;
  uint32_t hr;
  uint32_t la;
  uint32_t lb;
  uint32_t lg;
  uint32_t lr;
  uint local_158;
  uint local_144;
  uint local_120;
  uint local_10c;
  int local_fc;
  int aiStack_f8 [4];
  int aiStack_e8 [4];
  int aiStack_d8 [4];
  ulong local_c8;
  uint local_bc;
  int local_b8 [11];
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  uint local_7c;
  uint8_t local_78 [3] [4];
  uint8_t local_6c [4];
  undefined4 local_64;
  color_quad_u8 local_60;
  color_quad_u8 local_5c;
  byte *local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  ulong local_28;
  int *local_20;
  char local_11;
  long local_10;
  uint local_4;
  
  local_2c = 0xff;
  local_30 = 0xff;
  local_34 = 0xff;
  local_38 = 0xff;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  for (local_4c = 0; local_4c < in_EDI; local_4c = local_4c + 1) {
    local_58 = (byte *)(in_RSI + (ulong)local_4c * 4);
    if (*local_58 < local_2c) {
      local_2c = (uint)*local_58;
    }
    if (local_58[1] < local_30) {
      local_30 = (uint)local_58[1];
    }
    if (local_58[2] < local_34) {
      local_34 = (uint)local_58[2];
    }
    if (local_58[3] < local_38) {
      local_38 = (uint)local_58[3];
    }
    if (local_3c < *local_58) {
      local_3c = (uint)*local_58;
    }
    if (local_40 < local_58[1]) {
      local_40 = (uint)local_58[1];
    }
    if (local_44 < local_58[2]) {
      local_44 = (uint)local_58[2];
    }
    if (local_48 < local_58[3]) {
      local_48 = (uint)local_58[3];
    }
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  local_4 = in_EDI;
  color_quad_u8_set(&local_5c,local_2c,local_30,local_34,local_38);
  color_quad_u8_set(&local_60,local_3c,local_40,local_44,local_48);
  local_64 = 4;
  local_78[0][0] = local_5c.m_c[0];
  local_78[0][1] = local_5c.m_c[1];
  local_78[0][2] = local_5c.m_c[2];
  local_78[0][3] = local_5c.m_c[3];
  local_6c[0] = local_60.m_c[0];
  local_6c[1] = local_60.m_c[1];
  local_6c[2] = local_60.m_c[2];
  local_6c[3] = local_60.m_c[3];
  local_7c = 1;
  while( true ) {
    if (2 < local_7c) break;
    local_78[local_7c][0] =
         (uint8_t)(((uint)local_5c.m_c & 0xff) * (0x40 - g_bc7_weights2[local_7c]) +
                   ((uint)local_60.m_c & 0xff) * g_bc7_weights2[local_7c] + 0x20 >> 6);
    local_78[local_7c][1] =
         (uint8_t)((uint)local_5c.m_c[1] * (0x40 - g_bc7_weights2[local_7c]) +
                   (uint)local_60.m_c[1] * g_bc7_weights2[local_7c] + 0x20 >> 6);
    local_78[local_7c][2] =
         (uint8_t)((uint)local_5c.m_c[2] * (0x40 - g_bc7_weights2[local_7c]) +
                   (uint)local_60.m_c[2] * g_bc7_weights2[local_7c] + 0x20 >> 6);
    local_78[local_7c][3] =
         (uint8_t)((uint)local_5c.m_c[3] * (0x40 - g_bc7_weights2[local_7c]) +
                   (uint)local_60.m_c[3] * g_bc7_weights2[local_7c] + 0x20 >> 6);
    local_7c = local_7c + 1;
  }
  local_80 = ((uint)local_60.m_c & 0xff) - ((uint)local_5c.m_c & 0xff);
  local_84 = (uint)local_60.m_c[1] - (uint)local_5c.m_c[1];
  local_88 = (uint)local_60.m_c[2] - (uint)local_5c.m_c[2];
  local_8c = (uint)local_60.m_c[3] - (uint)local_5c.m_c[3];
  for (local_b8[3] = 0; (uint)local_b8[3] < 4; local_b8[3] = local_b8[3] + 1) {
    local_b8[(ulong)(uint)local_b8[3] + 4] =
         (uint)local_78[(uint)local_b8[3]][0] * local_80 +
         (uint)local_78[(uint)local_b8[3]][1] * local_84 +
         (uint)local_78[(uint)local_b8[3]][2] * local_88 +
         (uint)local_78[(uint)local_b8[3]][3] * local_8c;
  }
  for (local_bc = 0; local_bc < 3; local_bc = local_bc + 1) {
    local_b8[local_bc] =
         local_b8[(ulong)local_bc + 4] + local_b8[(ulong)(local_bc + 1) + 4] + 1 >> 1;
  }
  local_c8 = 0;
  if (local_11 == '\0') {
    for (local_144 = 0; local_144 < local_4; local_144 = local_144 + 1) {
      pbVar5 = (byte *)(local_10 + (ulong)local_144 * 4);
      iVar1 = local_80 * (uint)*pbVar5 + local_84 * (uint)pbVar5[1] + local_88 * (uint)pbVar5[2] +
              local_8c * (uint)pbVar5[3];
      if (iVar1 < local_b8[2]) {
        if (iVar1 < local_b8[1]) {
          local_158 = (uint)(local_b8[0] <= iVar1);
        }
        else {
          local_158 = 2;
        }
      }
      else {
        local_158 = 3;
      }
      uVar7 = (ulong)local_158;
      iVar1 = (uint)local_78[uVar7][0] - (uint)*pbVar5;
      iVar2 = (uint)local_78[uVar7][1] - (uint)pbVar5[1];
      iVar3 = (uint)local_78[uVar7][2] - (uint)pbVar5[2];
      iVar4 = (uint)local_78[uVar7][3] - (uint)pbVar5[3];
      local_c8 = (uint)(*local_20 * iVar1 * iVar1 + local_20[1] * iVar2 * iVar2 +
                        local_20[2] * iVar3 * iVar3 + local_20[3] * iVar4 * iVar4) + local_c8;
      if (local_28 < local_c8) {
        return local_c8;
      }
    }
  }
  else {
    for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
      lVar6 = (long)local_fc;
      aiStack_d8[local_fc] =
           (uint)local_78[lVar6][0] * 0x6d + (uint)local_78[lVar6][1] * 0x16e +
           (uint)local_78[lVar6][2] * 0x25;
      aiStack_e8[local_fc] = (uint)local_78[lVar6][0] * 0x200 - aiStack_d8[local_fc];
      aiStack_f8[local_fc] = (uint)local_78[lVar6][2] * 0x200 - aiStack_d8[local_fc];
    }
    for (local_10c = 0; local_10c < local_4; local_10c = local_10c + 1) {
      pbVar5 = (byte *)(local_10 + (ulong)local_10c * 4);
      iVar1 = local_80 * (uint)*pbVar5 + local_84 * (uint)pbVar5[1] + local_88 * (uint)pbVar5[2] +
              local_8c * (uint)pbVar5[3];
      if (iVar1 < local_b8[2]) {
        if (iVar1 < local_b8[1]) {
          local_120 = (uint)(local_b8[0] <= iVar1);
        }
        else {
          local_120 = 2;
        }
      }
      else {
        local_120 = 3;
      }
      iVar1 = (uint)*pbVar5 * 0x6d + (uint)pbVar5[1] * 0x16e + (uint)pbVar5[2] * 0x25;
      iVar2 = aiStack_d8[local_120] - iVar1 >> 8;
      iVar3 = (int)(aiStack_e8[local_120] - ((uint)*pbVar5 * 0x200 - iVar1)) >> 8;
      iVar1 = (int)(aiStack_f8[local_120] - ((uint)pbVar5[2] * 0x200 - iVar1)) >> 8;
      iVar4 = (uint)pbVar5[3] - (uint)local_78[local_120][3];
      local_c8 = (long)(*local_20 * iVar2 * iVar2 + local_20[1] * iVar3 * iVar3 +
                        local_20[2] * iVar1 * iVar1 + local_20[3] * iVar4 * iVar4) + local_c8;
      if (local_28 < local_c8) {
        return local_c8;
      }
    }
  }
  return local_c8;
}

Assistant:

static uint64_t color_cell_compression_est_mode7(uint32_t num_pixels, const color_quad_u8* pPixels, bc7enc_bool perceptual, uint32_t pweights[4], uint64_t best_err_so_far)
{
	// Find RGB bounds as an approximation of the block's principle axis
	uint32_t lr = 255, lg = 255, lb = 255, la = 255;
	uint32_t hr = 0, hg = 0, hb = 0, ha = 0;
	for (uint32_t i = 0; i < num_pixels; i++)
	{
		const color_quad_u8* pC = &pPixels[i];
		if (pC->m_c[0] < lr) lr = pC->m_c[0];
		if (pC->m_c[1] < lg) lg = pC->m_c[1];
		if (pC->m_c[2] < lb) lb = pC->m_c[2];
		if (pC->m_c[3] < la) la = pC->m_c[3];

		if (pC->m_c[0] > hr) hr = pC->m_c[0];
		if (pC->m_c[1] > hg) hg = pC->m_c[1];
		if (pC->m_c[2] > hb) hb = pC->m_c[2];
		if (pC->m_c[3] > ha) ha = pC->m_c[3];
	}

	color_quad_u8 lowColor; color_quad_u8_set(&lowColor, lr, lg, lb, la);
	color_quad_u8 highColor; color_quad_u8_set(&highColor, hr, hg, hb, ha);

	// Place endpoints at bbox diagonals and compute interpolated colors 
	const uint32_t N = 4;
	color_quad_u8 weightedColors[4];

	weightedColors[0] = lowColor;
	weightedColors[N - 1] = highColor;
	for (uint32_t i = 1; i < (N - 1); i++)
	{
		weightedColors[i].m_c[0] = (uint8_t)((lowColor.m_c[0] * (64 - g_bc7_weights2[i]) + highColor.m_c[0] * g_bc7_weights2[i] + 32) >> 6);
		weightedColors[i].m_c[1] = (uint8_t)((lowColor.m_c[1] * (64 - g_bc7_weights2[i]) + highColor.m_c[1] * g_bc7_weights2[i] + 32) >> 6);
		weightedColors[i].m_c[2] = (uint8_t)((lowColor.m_c[2] * (64 - g_bc7_weights2[i]) + highColor.m_c[2] * g_bc7_weights2[i] + 32) >> 6);
		weightedColors[i].m_c[3] = (uint8_t)((lowColor.m_c[3] * (64 - g_bc7_weights2[i]) + highColor.m_c[3] * g_bc7_weights2[i] + 32) >> 6);
	}

	// Compute dots and thresholds
	const int ar = highColor.m_c[0] - lowColor.m_c[0];
	const int ag = highColor.m_c[1] - lowColor.m_c[1];
	const int ab = highColor.m_c[2] - lowColor.m_c[2];
	const int aa = highColor.m_c[3] - lowColor.m_c[3];

	int dots[4];
	for (uint32_t i = 0; i < N; i++)
		dots[i] = weightedColors[i].m_c[0] * ar + weightedColors[i].m_c[1] * ag + weightedColors[i].m_c[2] * ab + weightedColors[i].m_c[3] * aa;

	int thresh[4 - 1];
	for (uint32_t i = 0; i < (N - 1); i++)
		thresh[i] = (dots[i] + dots[i + 1] + 1) >> 1;

	uint64_t total_err = 0;
	if (perceptual)
	{
		// Transform block's interpolated colors to YCbCr
		int l1[4], cr1[4], cb1[4];
		for (int j = 0; j < 4; j++)
		{
			const color_quad_u8* pE1 = &weightedColors[j];
			l1[j] = pE1->m_c[0] * 109 + pE1->m_c[1] * 366 + pE1->m_c[2] * 37;
			cr1[j] = ((int)pE1->m_c[0] << 9) - l1[j];
			cb1[j] = ((int)pE1->m_c[2] << 9) - l1[j];
		}

		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8* pC = &pPixels[i];

			int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2] + aa * pC->m_c[3];

			// Find approximate selector
			uint32_t s = 0;
			if (d >= thresh[2])
				s = 3;
			else if (d >= thresh[1])
				s = 2;
			else if (d >= thresh[0])
				s = 1;

			// Compute error
			const int l2 = pC->m_c[0] * 109 + pC->m_c[1] * 366 + pC->m_c[2] * 37;
			const int cr2 = ((int)pC->m_c[0] << 9) - l2;
			const int cb2 = ((int)pC->m_c[2] << 9) - l2;

			const int dl = (l1[s] - l2) >> 8;
			const int dcr = (cr1[s] - cr2) >> 8;
			const int dcb = (cb1[s] - cb2) >> 8;

			const int dca = (int)pC->m_c[3] - (int)weightedColors[s].m_c[3];

			int ie = (pweights[0] * dl * dl) + (pweights[1] * dcr * dcr) + (pweights[2] * dcb * dcb) + (pweights[3] * dca * dca);

			total_err += ie;
			if (total_err > best_err_so_far)
				break;
		}
	}
	else
	{
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8* pC = &pPixels[i];

			int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2] + aa * pC->m_c[3];

			// Find approximate selector
			uint32_t s = 0;
			if (d >= thresh[2])
				s = 3;
			else if (d >= thresh[1])
				s = 2;
			else if (d >= thresh[0])
				s = 1;

			// Compute error
			const color_quad_u8* pE1 = &weightedColors[s];

			int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
			int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
			int db = (int)pE1->m_c[2] - (int)pC->m_c[2];
			int da = (int)pE1->m_c[3] - (int)pC->m_c[3];

			total_err += pweights[0] * (dr * dr) + pweights[1] * (dg * dg) + pweights[2] * (db * db) + pweights[3] * (da * da);
			if (total_err > best_err_so_far)
				break;
		}
	}

	return total_err;
}